

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O3

void __thiscall
duckdb::TopNHeap::InitializeScan(TopNHeap *this,TopNScanState *state,bool exclude_offset)

{
  undefined8 uVar1;
  reference pvVar2;
  idx_t iVar3;
  long lVar4;
  size_type __n;
  unsafe_vector<TopNEntry> heap_copy;
  vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_> local_48;
  
  ::std::vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>::vector
            (&local_48,
             &(this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&(state->scan_order).super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             ((long)local_48.
                    super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_48.
                    super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  if (local_48.super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_48.super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar4 = 0x10;
    __n = 0;
    do {
      uVar1 = *(undefined8 *)
               ((long)&((local_48.
                         super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                         _M_impl.super__Vector_impl_data._M_start)->sort_key).value + lVar4);
      pvVar2 = vector<unsigned_int,_true>::operator[](&state->scan_order,__n);
      *pvVar2 = (value_type)uVar1;
      __n = __n + 1;
      lVar4 = lVar4 + 0x18;
    } while (__n < (ulong)(((long)local_48.
                                  super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_48.
                                  super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  if (exclude_offset) {
    iVar3 = this->offset;
  }
  else {
    iVar3 = 0;
  }
  state->pos = iVar3;
  if (local_48.super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TopNHeap::InitializeScan(TopNScanState &state, bool exclude_offset) {
	auto heap_copy = heap;
	state.scan_order.resize(heap_copy.size());

	// we sorted the heap in Finalize(), so we can sequentially here
	// we do this because sorting the heap is much more efficient than popping one by one
	for (idx_t i = 0; i < heap_copy.size(); i++) {
		state.scan_order[i] = UnsafeNumericCast<sel_t>(heap_copy[i].index);
	}

	state.pos = exclude_offset ? offset : 0;
}